

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O2

void __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede_ofb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
::reset(evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede_ofb>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
        *this)

{
  int iVar1;
  source_location local_50;
  evp_error local_38;
  
  iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)this->_context,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)0x0);
  if (iVar1 == 1) {
    padding(this,this->_padding);
    this->_total_input = 0;
    this->_total_output = 0;
    return;
  }
  local_38._32_8_ = 0;
  local_38._16_8_ = 0;
  local_38._24_8_ = 0;
  local_38._40_8_ = 0xffffffff;
  local_38._0_8_ = 0x2b7668;
  local_38._8_8_ = 0x2b7698;
  local_50.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/symmetric/basic_endec.hxx"
  ;
  local_50.function_ =
       "void cryptox::evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ede_ofb>, &EVP_DecryptInit_ex, &EVP_DecryptUpdate, &EVP_DecryptFinal_ex>::reset() [Algorithm = cryptox::symmetric_algorithm<&EVP_des_ede_ofb>, InitFx = &EVP_DecryptInit_ex, UpdateFx = &EVP_DecryptUpdate, FinalFx = &EVP_DecryptFinal_ex]"
  ;
  local_50.line_ = 0x44;
  local_50.column_ = 0;
  boost::throw_exception<cryptox::evp_error>(&local_38,&local_50);
}

Assistant:

void reset() {
			if (InitFx(_context, 0, 0, 0, 0) != 1)
				BOOST_THROW_EXCEPTION(evp_error(/* TODO */));

			padding(_padding);

			_total_input = 0;
			_total_output = 0;
		}